

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_underflow.c
# Opt level: O2

int main(void)

{
  size_t sVar1;
  char src [12];
  char local_10 [16];
  
  builtin_strncpy(local_10,"Hello World",0xc);
  sVar1 = strlen(local_10);
  while (sVar1 = (size_t)((int)sVar1 + -1), local_10[sVar1] != ':') {
    local_10[sVar1] = '\0';
  }
  return 0;
}

Assistant:

int main() {
  char src[12];
  strncpy(src, "Hello World", sizeof(src));

  size_t length = strlen(src);

  int index = (length -1);
  while (src[index] != ':') {
    src[index] = '\0';
    index--;
  }
}